

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialog::setLabel(QProgressDialog *this,QLabel *label)

{
  long lVar1;
  QProgressDialogPrivate *pQVar2;
  QLabel *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QProgressDialogPrivate *d;
  char *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffd8;
  QProgressDialogPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QProgressDialog *)0x7b132a);
  if (in_RSI == pQVar2->label) {
    if (in_RSI != (QLabel *)0x0) {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)in_RSI,(int)((ulong)pQVar2 >> 0x20),in_stack_ffffffffffffffb8);
      QMessageLogger::warning
                (&stack0xffffffffffffffd8,
                 "QProgressDialog::setLabel: Attempt to set the same label again");
    }
  }
  else {
    if (pQVar2->label != (QLabel *)0x0) {
      (**(code **)(*(long *)&(pQVar2->label->super_QFrame).super_QWidget + 0x20))();
    }
    pQVar2->label = in_RSI;
    QProgressDialogPrivate::adoptChildWidget(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialog::setLabel(QLabel *label)
{
    Q_D(QProgressDialog);
    if (label == d->label) {
        if (Q_UNLIKELY(label))
            qWarning("QProgressDialog::setLabel: Attempt to set the same label again");
        return;
    }
    delete d->label;
    d->label = label;
    d->adoptChildWidget(label);
}